

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

long __thiscall tetgenmesh::improvequalitybysmoothing(tetgenmesh *this,optparameters *opm)

{
  triface *searchtet;
  uint *puVar1;
  triface *cosmaxd;
  arraypool *this_00;
  char *pcVar2;
  long lVar3;
  char **ppcVar4;
  byte bVar5;
  int iVar6;
  arraypool *paVar7;
  char *pcVar8;
  long lVar9;
  byte bVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  tetrahedron *local_78;
  
  paVar7 = (arraypool *)operator_new(0x30);
  paVar7->objectbytes = 0x88;
  paVar7->objectsperblock = 0x400;
  paVar7->log2objectsperblock = 10;
  paVar7->objectsperblockmark = 0x3ff;
  paVar7->toparraylen = 0;
  paVar7->toparray = (char **)0x0;
  paVar7->objects = 0;
  paVar7->totalmemory = 0;
  lVar9 = 0;
  bVar5 = 0;
  uVar14 = 0;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar7;
    if (this_00->objects < 1) break;
    if (1 < this->b->verbose) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",uVar14);
    }
    if (this_00->objects < 1) {
      lVar16 = 0;
    }
    else {
      lVar11 = 0;
      lVar16 = 0;
      do {
        pcVar2 = this_00->toparray[(uint)lVar11 >> ((byte)this_00->log2objectsperblock & 0x1f)];
        lVar15 = (long)this_00->objectbytes *
                 (long)(int)(this_00->objectsperblockmark & (uint)lVar11);
        searchtet = (triface *)(pcVar2 + lVar15);
        iVar6 = gettetrahedron(this,*(point *)(pcVar2 + lVar15 + 0x58),
                               *(point *)(pcVar2 + lVar15 + 0x60),*(point *)(pcVar2 + lVar15 + 0x68)
                               ,*(point *)(pcVar2 + lVar15 + 0x70),searchtet);
        if ((iVar6 != 0) &&
           (local_78 = searchtet->tet,
           (*(byte *)((long)local_78 + (long)this->elemmarkerindex * 4) & 2) == 0)) {
          cosmaxd = searchtet + 2;
          tetalldihedral(this,(point)local_78[4],(point)local_78[5],(point)local_78[6],
                         (point)local_78[7],(double *)&searchtet[2].ver,(double *)cosmaxd,
                         (double *)0x0);
          if ((double)searchtet[2].tet < this->cossmtdihed) {
            local_78 = local_78 + 4;
            opm->initval = (double)searchtet[2].tet + 1.0;
            uVar12 = 0;
            iVar6 = 0;
            do {
              if ((*(uint *)((long)local_78[uVar12] + (long)this->pointmarkindex * 4 + 4) &
                  0xffffff00) == 0x800) {
                getvertexstar(this,1,(point)local_78[uVar12],this->cavetetlist,(arraypool *)0x0,
                              (arraypool *)0x0);
                opm->searchstep = 0.001;
                iVar6 = smoothpoint(this,(point)local_78[uVar12],this->cavetetlist,1,opm);
                if (iVar6 != 0) {
                  if (opm->smthiter == opm->maxiter) {
                    do {
                      opm->searchstep = opm->searchstep * 10.0;
                      opm->initval = opm->imprval;
                      opm->smthiter = 0;
                      smoothpoint(this,(point)local_78[uVar12],this->cavetetlist,1,opm);
                    } while (opm->smthiter == opm->maxiter);
                  }
                  lVar16 = lVar16 + 1;
                  if ((opm->imprval + -1.0 < this->cossmtdihed) &&
                     (paVar7 = this->cavetetlist, 0 < paVar7->objects)) {
                    lVar15 = 0;
                    do {
                      pcVar2 = paVar7->toparray
                               [(uint)lVar15 >> ((byte)paVar7->log2objectsperblock & 0x1f)];
                      lVar17 = (long)paVar7->objectbytes *
                               (long)(int)(paVar7->objectsperblockmark & (uint)lVar15);
                      lVar3 = *(long *)(pcVar2 + lVar17);
                      if ((*(byte *)(lVar3 + (long)this->elemmarkerindex * 4) & 2) == 0) {
                        local_78 = (tetrahedron *)(lVar3 + 0x20);
                        tetalldihedral(this,*(point *)(lVar3 + 0x20),*(point *)(lVar3 + 0x28),
                                       *(point *)(lVar3 + 0x30),*(point *)(lVar3 + 0x38),
                                       (double *)&searchtet[2].ver,(double *)cosmaxd,(double *)0x0);
                        if ((double)cosmaxd->tet <= this->cossmtdihed &&
                            this->cossmtdihed != (double)cosmaxd->tet) {
                          puVar1 = (uint *)(*(long *)(pcVar2 + lVar17) +
                                           (long)this->elemmarkerindex * 4);
                          *puVar1 = *puVar1 | 2;
                          paVar7 = this->unflipqueue;
                          pcVar8 = arraypool::getblock(paVar7,(int)paVar7->objects);
                          lVar13 = (long)paVar7->objectbytes *
                                   ((long)paVar7->objectsperblock - 1U & paVar7->objects);
                          paVar7->objects = paVar7->objects + 1;
                          *(undefined8 *)(pcVar8 + lVar13) = *(undefined8 *)(pcVar2 + lVar17);
                          *(undefined4 *)(pcVar8 + lVar13 + 8) =
                               *(undefined4 *)(pcVar2 + lVar17 + 8);
                          *(undefined8 *)(pcVar8 + lVar13 + 0x58) = *(undefined8 *)(lVar3 + 0x20);
                          *(undefined8 *)(pcVar8 + lVar13 + 0x60) = *(undefined8 *)(lVar3 + 0x28);
                          *(undefined8 *)(pcVar8 + lVar13 + 0x68) = *(undefined8 *)(lVar3 + 0x30);
                          *(undefined8 *)(pcVar8 + lVar13 + 0x70) = *(undefined8 *)(lVar3 + 0x38);
                          pcVar2 = pcVar8 + lVar13 + 8;
                          pcVar2[0] = '\v';
                          pcVar2[1] = '\0';
                          pcVar2[2] = '\0';
                          pcVar2[3] = '\0';
                          pcVar8 = pcVar8 + lVar13 + 0x20;
                          pcVar8[0] = '\0';
                          pcVar8[1] = '\0';
                          pcVar8[2] = '\0';
                          pcVar8[3] = '\0';
                          pcVar8[4] = '\0';
                          pcVar8[5] = '\0';
                          pcVar8[6] = '\0';
                          pcVar8[7] = '\0';
                        }
                      }
                      lVar15 = lVar15 + 1;
                      paVar7 = this->cavetetlist;
                    } while (lVar15 < paVar7->objects);
                  }
                }
                this->cavetetlist->objects = 0;
              }
            } while ((uVar12 < 3) && (uVar12 = uVar12 + 1, iVar6 == 0));
            if (iVar6 == 0) {
              puVar1 = (uint *)((long)searchtet->tet + (long)this->elemmarkerindex * 4);
              *puVar1 = *puVar1 | 2;
              paVar7 = this->unflipqueue;
              pcVar8 = arraypool::getblock(paVar7,(int)paVar7->objects);
              lVar15 = (long)paVar7->objectbytes *
                       ((long)paVar7->objectsperblock - 1U & paVar7->objects);
              paVar7->objects = paVar7->objects + 1;
              *(tetrahedron **)(pcVar8 + lVar15) = searchtet->tet;
              *(int *)(pcVar8 + lVar15 + 8) = searchtet->ver;
              *(tetrahedron *)(pcVar8 + lVar15 + 0x58) = *local_78;
              *(tetrahedron *)(pcVar8 + lVar15 + 0x60) = local_78[1];
              *(tetrahedron *)(pcVar8 + lVar15 + 0x68) = local_78[2];
              *(tetrahedron *)(pcVar8 + lVar15 + 0x70) = local_78[3];
              pcVar2 = pcVar8 + lVar15 + 8;
              pcVar2[0] = '\v';
              pcVar2[1] = '\0';
              pcVar2[2] = '\0';
              pcVar2[3] = '\0';
              pcVar8 = pcVar8 + lVar15 + 0x20;
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              pcVar8[4] = '\0';
              pcVar8[5] = '\0';
              pcVar8[6] = '\0';
              pcVar8[7] = '\0';
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < this_00->objects);
    }
    this_00->objects = 0;
    paVar7 = this->unflipqueue;
    lVar11 = paVar7->objects;
    if (0 < lVar11) {
      ppcVar4 = paVar7->toparray;
      lVar15 = 0;
      do {
        puVar1 = (uint *)(*(long *)(ppcVar4[(uint)lVar15 >>
                                            ((byte)paVar7->log2objectsperblock & 0x1f)] +
                                   (long)paVar7->objectbytes *
                                   (long)(int)(paVar7->objectsperblockmark & (uint)lVar15)) +
                         (long)this->elemmarkerindex * 4);
        *puVar1 = *puVar1 & 0xfffffffd;
        lVar15 = lVar15 + 1;
      } while (lVar11 != lVar15);
    }
    if (1 < this->b->verbose) {
      printf("    Smooth %ld points.\n",lVar16);
    }
    lVar9 = lVar9 + lVar16;
    bVar10 = ~bVar5;
    uVar14 = 1;
    bVar5 = 1;
    paVar7 = this_00;
  } while ((bool)(bVar10 & lVar16 != 0));
  if (this_00 != (arraypool *)0x0) {
    arraypool::~arraypool(this_00);
    operator_delete(this_00,0x30);
  }
  return lVar9;
}

Assistant:

long tetgenmesh::improvequalitybysmoothing(optparameters *opm)
{
  arraypool *flipqueue, *swapqueue;
  triface *parytet;
  badface *bface, *parybface;
  point *ppt;
  long totalsmtcount, smtcount;
  int smtflag;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsmtcount = 0l;
  iter = 0;

  while (flipqueue->objects > 0l) {

    smtcount = 0l;

    if (b->verbose > 1) {
      printf("    Improving mesh quality by smoothing [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; k < flipqueue->objects; k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        // Operate on it if it is not in 'unflipqueue'.
        if (!marktested(bface->tt)) {
          // Here we simply re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
          if (bface->key < cossmtdihed) { // if (maxdd < cosslidihed) {
            // It is a sliver. Try to smooth its vertices.
            smtflag = 0;
            opm->initval = bface->key + 1.0; 
            for (i = 0; (i < 4) && !smtflag; i++) {
              if (pointtype(ppt[i]) == FREEVOLVERTEX) {
                getvertexstar(1, ppt[i], cavetetlist, NULL, NULL);
                opm->searchstep = 0.001; // Search step size
                smtflag = smoothpoint(ppt[i], cavetetlist, 1, opm);
                if (smtflag) {
                  while (opm->smthiter == opm->maxiter) {
                    opm->searchstep *= 10.0; // Increase the step size.
                    opm->initval = opm->imprval;
                    opm->smthiter = 0; // reset
                    smoothpoint(ppt[i], cavetetlist, 1, opm);
                  }
                  // This tet is modifed.
                  smtcount++;
                  if ((opm->imprval - 1.0) < cossmtdihed) {
                    // There are slivers in new tets. Queue them.
                    for (j = 0; j < cavetetlist->objects; j++) {
                      parytet = (triface *) fastlookup(cavetetlist, j);
                      // Operate it if it is not in 'unflipqueue'.
                      if (!marktested(*parytet)) {
                        // Evaluate its quality.
                        // Re-use ppt, bface->key, bface->cent.
                        ppt = (point *) & (parytet->tet[4]);
                        tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], 
                                       bface->cent, &bface->key, NULL);
                        if (bface->key < cossmtdihed) {
                          // A new sliver. Queue it.
                          marktest(*parytet); // It is in unflipqueue.
                          unflipqueue->newindex((void **) &parybface);
                          parybface->tt = *parytet;
                          parybface->forg = ppt[0];
                          parybface->fdest = ppt[1];
                          parybface->fapex = ppt[2];
                          parybface->foppo = ppt[3];
                          parybface->tt.ver = 11; 
                          parybface->key = 0.0;
                        }
                      }
                    } // j
                  } // if ((opm->imprval - 1.0) < cossmtdihed)
                } // if (smtflag)
                cavetetlist->restart();
              } // if (pointtype(ppt[i]) == FREEVOLVERTEX)
            } // i
            if (!smtflag) {
              // Didn't smooth. Queue it again.
              marktest(bface->tt); // It is in unflipqueue.
              unflipqueue->newindex((void **) &parybface);
              parybface->tt = bface->tt;
              parybface->forg = ppt[0];
              parybface->fdest = ppt[1];
              parybface->fapex = ppt[2];
              parybface->foppo = ppt[3];
              parybface->tt.ver = 11;
              parybface->key = 0.0;
            }
	      } // if (maxdd < cosslidihed)
        } // if (!marktested(...))
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    // Unmark the tets in unflipqueue.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface  = (badface *) fastlookup(unflipqueue, i);
      unmarktest(bface->tt);
    }

    if (b->verbose > 1) {
      printf("    Smooth %ld points.\n", smtcount);
    }
    totalsmtcount += smtcount;

    if (smtcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsmtcount;
}